

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# augmentedmatrix.cpp
# Opt level: O2

bool __thiscall AugmentedMatrix::setAugmentData(AugmentedMatrix *this,fraction *values,int height)

{
  ulong uVar1;
  ulong uVar2;
  
  this->height = height;
  uVar1 = 0;
  uVar2 = (ulong)(uint)height;
  if (height < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 * 0x10 != uVar1; uVar1 = uVar1 + 0x10) {
    *(unkbyte10 *)((long)this->augment + uVar1) = *(unkbyte10 *)((long)values + uVar1);
  }
  return true;
}

Assistant:

bool AugmentedMatrix::setAugmentData( fraction *values , int height)
{
    this->height = height;
    for( int i(0) ; i < this->height ; i++)
        augment[i]  = values[i];
    return true;
}